

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

DigitalConsumer * __thiscall
AbstractModuleClient::subscribeDigitalData
          (AbstractModuleClient *this,size_t buffersize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels)

{
  SubType SVar1;
  network_pimpl *this_00;
  bool bVar2;
  DigitalConsumer *this_01;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  allocator local_482;
  allocator local_481;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  HFParsingInfo local_468;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  HFSubSockSettings local_368;
  HFParsingInfo local_2c0;
  HighFreqDataType local_280;
  HighFreqDataType local_1f0;
  HighFreqDataType local_160;
  HFSubSockSettings local_d0;
  
  std::__cxx11::string::string((string *)&local_388,"digitalstream",(allocator *)&local_368);
  std::__cxx11::string::string((string *)&local_3a8,"Trodes",(allocator *)&local_280);
  bVar2 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_388,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_3c8,"digitalstream",(allocator *)&local_368);
    std::__cxx11::string::string((string *)&local_3e8,"Trodes",(allocator *)&local_280);
    this_01 = (DigitalConsumer *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_3c8,&local_3e8)
    ;
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
  }
  else {
    this_00 = (this->super_MlmWrap).state;
    std::__cxx11::string::string((string *)&local_368,"digitalstream",&local_481);
    std::__cxx11::string::string((string *)&local_468,"Trodes",&local_482);
    network_pimpl::find_hfdt(&local_280,this_00,(string *)&local_368,(string *)&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_368);
    bVar2 = HighFreqDataType::isValid(&local_280);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_480,channels);
      HighFreqDataType::getDataFormat_abi_cxx11_(&local_428,&local_280);
      MlmWrap::createDigitalParsingInfo(&local_468,&this->super_MlmWrap,&local_480,&local_428);
      std::__cxx11::string::~string((string *)&local_428);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_480);
      this_01 = (DigitalConsumer *)operator_new(0x450);
      HighFreqDataType::HighFreqDataType(&local_160,&local_280);
      HFParsingInfo::HFParsingInfo(&local_2c0,&local_468);
      DigitalConsumer::DigitalConsumer(this_01,&local_160,(int)buffersize,&local_2c0);
      HFParsingInfo::~HFParsingInfo(&local_2c0);
      HighFreqDataType::~HighFreqDataType(&local_160);
      HighFreqDataType::HighFreqDataType(&local_1f0,&local_280);
      SVar1 = (this_01->super_HFSubConsumer).super_HighFreqSub.sockType;
      HighFreqDataType::HighFreqDataType(&local_368.dataType,&local_1f0);
      local_368.userFoo = (hfs_data_callback_fn)0x0;
      local_368.args = (void *)0x0;
      local_368.subSockType = SVar1;
      HighFreqDataType::~HighFreqDataType(&local_1f0);
      MlmWrap::addSubToList(&this->super_MlmWrap,(HighFreqSub *)this_01);
      HFSubSockSettings::HFSubSockSettings(&local_d0,&local_368);
      MlmWrap::addHfTypeToSubbedList(&this->super_MlmWrap,&local_d0);
      HighFreqDataType::~HighFreqDataType(&local_d0.dataType);
      HighFreqDataType::~HighFreqDataType(&local_368.dataType);
      HFParsingInfo::~HFParsingInfo(&local_468);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_408,"Digital data could not be found on the network!",
                 (allocator *)&local_468);
      MlmWrap::error((string *)&local_368,&this->super_MlmWrap,&local_408);
      std::operator<<((ostream *)&std::cerr,(string *)&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_408);
      this_01 = (DigitalConsumer *)0x0;
    }
    HighFreqDataType::~HighFreqDataType(&local_280);
  }
  return this_01;
}

Assistant:

DigitalConsumer* AbstractModuleClient::subscribeDigitalData(size_t buffersize, std::vector<std::string> channels){
    if(isHfTypeCurrentlySubbed(hfType_DIGITAL, TRODES_NETWORK_ID)){
        return (DigitalConsumer*)getHfSubObject(hfType_DIGITAL, TRODES_NETWORK_ID);
    }
    HighFreqDataType dt = state->find_hfdt(hfType_DIGITAL, TRODES_NETWORK_ID);
    if(!dt.isValid()){
        std::cerr << error("Digital data could not be found on the network!");
        return NULL;
    }
    HFParsingInfo parseinfo = createDigitalParsingInfo(channels, dt.getDataFormat());
    DigitalConsumer* newsub = new DigitalConsumer(dt, buffersize, parseinfo);
    HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
    addSubToList(newsub);
    addHfTypeToSubbedList(sockinfo);
    return newsub;
}